

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O1

Source_File * get_source_file(char *filename,char **where_to_search)

{
  char **ppcVar1;
  char *__filename;
  FILE *in;
  Source_Name *name;
  Source_File *pSVar2;
  
  if (where_to_search == (char **)0x0) {
    __assert_fail("where_to_search!=NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/program/program.c"
                  ,99,"struct Source_File *get_source_file(char *, char **)");
  }
  if (*where_to_search != (char *)0x0) {
    do {
      __filename = gstr_append(*where_to_search,filename);
      in = fopen(__filename,"r");
      free(__filename);
      if (in != (FILE *)0x0) {
        name = get_source_name(filename,*where_to_search);
        pSVar2 = extract_source_file((FILE *)in,name);
        if (pSVar2 != (Source_File *)0x0) {
          return pSVar2;
        }
        delete_source_name(name);
      }
      ppcVar1 = where_to_search + 1;
      where_to_search = where_to_search + 1;
    } while (*ppcVar1 != (char *)0x0);
    return (Source_File *)0x0;
  }
  __assert_fail("*where_to_search!=NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/program/program.c"
                ,100,"struct Source_File *get_source_file(char *, char **)");
}

Assistant:

struct Source_File* get_source_file(char *filename,char **where_to_search)
{
	FILE *in;
	char *temp_name;
	char is_directory=0;
	struct Source_Name *name;
	struct Source_File *file;

	assert(where_to_search!=NULL);
	assert(*where_to_search!=NULL);
	do
	{
		temp_name=gstr_append(*where_to_search,filename);
		in=fopen(temp_name,"r");
		free(temp_name);
		if(in==NULL)
			continue;

		name=get_source_name(filename,*where_to_search);
		file=extract_source_file(in,name);
		if(file!=NULL)
		{
			return file;
		}else
		{
			delete_source_name(name);
		}
	}while(*(++where_to_search));
	return NULL;
}